

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

Block * __thiscall
CFG::Relooper::AddBlock(Relooper *this,Expression *CodeInit,Expression *SwitchConditionInit)

{
  int iVar1;
  pointer pBVar2;
  Block *blockPtr;
  unique_ptr<CFG::Block,_std::default_delete<CFG::Block>_> local_28;
  __single_object block;
  Expression *SwitchConditionInit_local;
  Expression *CodeInit_local;
  Relooper *this_local;
  
  blockPtr = (Block *)this;
  block._M_t.super___uniq_ptr_impl<CFG::Block,_std::default_delete<CFG::Block>_>._M_t.
  super__Tuple_impl<0UL,_CFG::Block_*,_std::default_delete<CFG::Block>_>.
  super__Head_base<0UL,_CFG::Block_*,_false>._M_head_impl =
       (__uniq_ptr_data<CFG::Block,_std::default_delete<CFG::Block>,_true,_true>)
       (__uniq_ptr_data<CFG::Block,_std::default_delete<CFG::Block>,_true,_true>)SwitchConditionInit
  ;
  SwitchConditionInit_local = CodeInit;
  CodeInit_local = (Expression *)this;
  std::make_unique<CFG::Block,CFG::Relooper*,wasm::Expression*&,wasm::Expression*&>
            ((Relooper **)&local_28,(Expression **)&blockPtr,&SwitchConditionInit_local);
  iVar1 = this->BlockIdCounter;
  this->BlockIdCounter = iVar1 + 1;
  pBVar2 = std::unique_ptr<CFG::Block,_std::default_delete<CFG::Block>_>::operator->(&local_28);
  pBVar2->Id = iVar1;
  pBVar2 = std::unique_ptr<CFG::Block,_std::default_delete<CFG::Block>_>::get(&local_28);
  std::
  deque<std::unique_ptr<CFG::Block,_std::default_delete<CFG::Block>_>,_std::allocator<std::unique_ptr<CFG::Block,_std::default_delete<CFG::Block>_>_>_>
  ::push_back(&this->Blocks,&local_28);
  std::unique_ptr<CFG::Block,_std::default_delete<CFG::Block>_>::~unique_ptr(&local_28);
  return pBVar2;
}

Assistant:

Block* Relooper::AddBlock(wasm::Expression* CodeInit,
                          wasm::Expression* SwitchConditionInit) {

  auto block = std::make_unique<Block>(this, CodeInit, SwitchConditionInit);
  block->Id = BlockIdCounter++;
  auto* blockPtr = block.get();
  Blocks.push_back(std::move(block));
  return blockPtr;
}